

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O3

void __thiscall absl::AlphaNum::AlphaNum(AlphaNum *this,Dec dec)

{
  AlphaNum *pAVar1;
  bool bVar2;
  char __tmp;
  ulong uVar3;
  size_t __n;
  byte bVar4;
  ulong uVar5;
  AlphaNum *pAVar6;
  char *__s;
  
  uVar3 = dec.value;
  (this->piece_).ptr_ = (char *)0x0;
  (this->piece_).length_ = 0;
  if (dec.width < 0x21) {
    pAVar1 = this + 1;
    uVar5 = uVar3;
    pAVar6 = pAVar1;
    if (9 < uVar3) {
      do {
        uVar3 = uVar5 / 10;
        pAVar6[-1].digits_[0x1f] = (char)uVar5 + (char)uVar3 * -10 | 0x30;
        pAVar6 = (AlphaNum *)(pAVar6[-1].digits_ + 0x1f);
        bVar2 = 99 < uVar5;
        uVar5 = uVar3;
      } while (bVar2);
    }
    pAVar6[-1].digits_[0x1f] = (byte)uVar3 | 0x30;
    if ((dec._8_4_ >> 0x10 & 1) == 0) {
      __s = pAVar6[-1].digits_ + 0x1f;
    }
    else {
      pAVar6[-1].digits_[0x1e] = '-';
      __s = pAVar6[-1].digits_ + 0x1e;
    }
    __n = (long)__s - ((long)pAVar1 - (ulong)(dec._8_4_ & 0x3f));
    if (0 < (long)__n) {
      bVar4 = dec.fill == '0' & dec.neg;
      __s = __s + (bVar4 - __n);
      memset(__s,dec._9_4_ & 0xff,__n);
      if (bVar4 == 1) {
        __s[-1] = '-';
        __s = __s + -1;
      }
    }
    if (-1 < (long)pAVar1 - (long)__s) {
      (this->piece_).ptr_ = __s;
      (this->piece_).length_ = (long)pAVar1 - (long)__s;
      return;
    }
    absl::AlphaNum();
  }
  __assert_fail("dec.width <= numbers_internal::kFastToBufferSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                ,0x31,"absl::AlphaNum::AlphaNum(Dec)");
}

Assistant:

AlphaNum::AlphaNum(Dec dec) {
  assert(dec.width <= numbers_internal::kFastToBufferSize);
  char* const end = &digits_[numbers_internal::kFastToBufferSize];
  char* const minfill = end - dec.width;
  char* writer = end;
  uint64_t value = dec.value;
  bool neg = dec.neg;
  while (value > 9) {
    *--writer = '0' + (value % 10);
    value /= 10;
  }
  *--writer = '0' + value;
  if (neg) *--writer = '-';

  ptrdiff_t fillers = writer - minfill;
  if (fillers > 0) {
    // Tricky: if the fill character is ' ', then it's <fill><+/-><digits>
    // But...: if the fill character is '0', then it's <+/-><fill><digits>
    bool add_sign_again = false;
    if (neg && dec.fill == '0') {  // If filling with '0',
      ++writer;                    // ignore the sign we just added
      add_sign_again = true;       // and re-add the sign later.
    }
    writer -= fillers;
    std::fill_n(writer, fillers, dec.fill);
    if (add_sign_again) *--writer = '-';
  }

  piece_ = absl::string_view(writer, end - writer);
}